

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  nk_vec2 uv;
  nk_buffer *b;
  void *pvVar1;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_draw_index nVar2;
  void *pvVar3;
  nk_draw_index *pnVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  nk_draw_index nVar11;
  nk_draw_index nVar12;
  uint uVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x263a,
                  "void nk_draw_list_fill_poly_convex(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_anti_aliasing)"
                 );
  }
  if (2 < points_count) {
    config = &list->config;
    color_00.r = (float)((uint)color & 0xff) * 0.003921569;
    fVar16 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
    color_01.b = (float)((uint)color >> 0x10 & 0xff) * 0.003921569;
    fVar17 = (float)((int)((float)((uint)color >> 0x18) * (list->config).global_alpha) & 0xff) *
             0.003921569;
    color_02.a = fVar17;
    color_02.b = color_01.b;
    uVar13 = list->vertex_count;
    nVar11 = (nk_draw_index)uVar13;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      pvVar3 = nk_draw_list_alloc_vertices(list,(ulong)(points_count * 2));
      pnVar4 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 9 - 6));
      if (pnVar4 != (nk_draw_index *)0x0 && pvVar3 != (void *)0x0) {
        b = list->vertices;
        if (b == (nk_buffer *)0x0) {
          __assert_fail("buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x1fab,
                        "void nk_buffer_mark(struct nk_buffer *, enum nk_buffer_allocation_type)");
        }
        pvVar1 = (b->memory).ptr;
        b->marker[0].active = 1;
        b->marker[0].offset = b->allocated;
        uVar15 = (ulong)points_count;
        pvVar5 = nk_buffer_alloc(b,NK_BUFFER_FRONT,uVar15 * 8,4);
        if (pvVar5 != (void *)0x0) {
          pvVar3 = (void *)((long)pvVar3 + ((long)(list->vertices->memory).ptr - (long)pvVar1));
          lVar6 = uVar15 - 2;
          iVar8 = uVar13 + 2;
          do {
            *pnVar4 = nVar11;
            pnVar4[1] = (nk_draw_index)iVar8;
            iVar8 = iVar8 + 2;
            pnVar4[2] = (nk_draw_index)iVar8;
            pnVar4 = pnVar4 + 3;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          uVar10 = 0;
          uVar9 = (ulong)(points_count - 1);
          do {
            uVar7 = uVar10;
            fVar18 = points[uVar7].x - points[uVar9].x;
            fVar19 = points[uVar7].y - points[uVar9].y;
            fVar20 = fVar18 * fVar18 + fVar19 * fVar19;
            fVar14 = 1.0;
            if ((fVar20 != 0.0) || (NAN(fVar20))) {
              fVar14 = (float)(0x5f375a84 - ((uint)fVar20 >> 1));
              fVar14 = (fVar20 * -0.5 * fVar14 * fVar14 + 1.5) * fVar14;
            }
            *(float *)((long)pvVar5 + uVar9 * 8) = fVar19 * fVar14;
            *(float *)((long)pvVar5 + uVar9 * 8 + 4) = -fVar18 * fVar14;
            uVar10 = uVar7 + 1;
            uVar9 = uVar7;
          } while (uVar15 != uVar7 + 1);
          uVar10 = (ulong)(points_count - 1);
          uVar9 = 0;
          do {
            fVar19 = (*(float *)((long)pvVar5 + uVar10 * 8) + *(float *)((long)pvVar5 + uVar9 * 8))
                     * 0.5;
            fVar14 = (*(float *)((long)pvVar5 + uVar10 * 8 + 4) +
                     *(float *)((long)pvVar5 + uVar9 * 8 + 4)) * 0.5;
            fVar18 = fVar19 * fVar19 + fVar14 * fVar14;
            if (1e-06 < fVar18) {
              fVar18 = 1.0 / fVar18;
              if (100.0 <= fVar18) {
                fVar18 = 100.0;
              }
              fVar19 = fVar19 * fVar18;
              fVar14 = fVar14 * fVar18;
            }
            color_00.g = fVar16;
            uv = (list->config).null.uv;
            color_00.b = color_01.b;
            color_00.a = fVar17;
            pos.y = points[uVar9].y - fVar14 * 0.5;
            pos.x = points[uVar9].x - fVar19 * 0.5;
            pvVar3 = nk_draw_vertex(pvVar3,config,pos,uv,color_00);
            color_01.g = fVar16;
            color_01.r = color_00.r;
            color_01.a = 0.0;
            pos_00.y = fVar14 * 0.5 + points[uVar9].y;
            pos_00.x = fVar19 * 0.5 + points[uVar9].x;
            pvVar3 = nk_draw_vertex(pvVar3,config,pos_00,uv,color_01);
            nVar12 = (nk_draw_index)uVar13;
            *pnVar4 = nVar12;
            pnVar4[1] = nVar11 + (short)uVar10 * 2;
            nVar2 = nVar11 + 1 + (short)uVar10 * 2;
            pnVar4[2] = nVar2;
            pnVar4[3] = nVar2;
            pnVar4[4] = nVar12 + 1;
            pnVar4[5] = nVar12;
            pnVar4 = pnVar4 + 6;
            uVar7 = uVar9 + 1;
            uVar13 = uVar13 + 2;
            uVar10 = uVar9;
            uVar9 = uVar7;
          } while (uVar15 != uVar7);
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
          return;
        }
      }
    }
    else {
      uVar15 = (ulong)points_count;
      pvVar3 = nk_draw_list_alloc_vertices(list,uVar15);
      pnVar4 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 3 - 6));
      if (pnVar4 != (nk_draw_index *)0x0 && pvVar3 != (void *)0x0) {
        uVar10 = 0;
        do {
          color_02.g = fVar16;
          color_02.r = color_00.r;
          pvVar3 = nk_draw_vertex(pvVar3,config,points[uVar10],(list->config).null.uv,color_02);
          uVar10 = uVar10 + 1;
        } while (uVar15 != uVar10);
        iVar8 = uVar13 + 2;
        lVar6 = 0;
        do {
          *(nk_draw_index *)((long)pnVar4 + lVar6) = nVar11;
          *(short *)((long)pnVar4 + lVar6 + 2) = (short)iVar8 + -1;
          *(short *)((long)pnVar4 + lVar6 + 4) = (short)iVar8;
          lVar6 = lVar6 + 6;
          iVar8 = iVar8 + 1;
        } while (uVar15 * 6 + -0xc != lVar6);
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
    const struct nk_vec2 *points, const unsigned int points_count,
    struct nk_color color, enum nk_anti_aliasing aliasing)
{
    struct nk_colorf col;
    struct nk_colorf col_trans;

    NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
    NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
    NK_ASSERT(list);
    if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        nk_size i = 0;
        nk_size i0 = 0;
        nk_size i1 = 0;

        const float AA_SIZE = 1.0f;
        nk_size vertex_offset = 0;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (points_count-2)*3 + points_count*6;
        const nk_size vtx_count = (points_count*2);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size = 0;
        struct nk_vec2 *normals = 0;
        unsigned int vtx_inner_idx = (unsigned int)(index + 0);
        unsigned int vtx_outer_idx = (unsigned int)(index + 1);
        if (!vtx || !ids) return;

        /* temporary allocate normals */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        if (!normals) return;
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* add elements */
        for (i = 2; i < points_count; i++) {
            ids[0] = (nk_draw_index)(vtx_inner_idx);
            ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
            ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
            ids += 3;
        }

        /* compute normals */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            struct nk_vec2 p0 = points[i0];
            struct nk_vec2 p1 = points[i1];
            struct nk_vec2 diff = nk_vec2_sub(p1, p0);

            /* vec2 inverted length  */
            float len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            normals[i0].x = diff.y;
            normals[i0].y = -diff.x;
        }

        /* add vertices + indexes */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            const struct nk_vec2 uv = list->config.null.uv;
            struct nk_vec2 n0 = normals[i0];
            struct nk_vec2 n1 = normals[i1];
            struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f) {
                float scale = 1.0f / dmr2;
                scale = NK_MIN(scale, 100.0f);
                dm = nk_vec2_muls(dm, scale);
            }
            dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

            /* add vertices */
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

            /* add indexes */
            ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
            ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
            ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids += 6;
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        nk_size i = 0;
        nk_size index = list->vertex_count;
        const nk_size idx_count = (points_count-2)*3;
        const nk_size vtx_count = points_count;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        if (!vtx || !ids) return;
        for (i = 0; i < vtx_count; ++i)
            vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
        for (i = 2; i < points_count; ++i) {
            ids[0] = (nk_draw_index)index;
            ids[1] = (nk_draw_index)(index+ i - 1);
            ids[2] = (nk_draw_index)(index+i);
            ids += 3;
        }
    }
}